

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O2

void __thiscall TTD::EventLog::SetModeFlagsOnContext(EventLog *this,ScriptContext *ctx)

{
  TTDMode TVar1;
  undefined4 uVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  
  TVar1 = this->m_currentMode;
  bVar4 = (TVar1 & (AnyExcludedMode|RecordMode)) == RecordMode;
  ctx->TTDRecordModeEnabled = bVar4;
  bVar5 = (TVar1 & (AnyExcludedMode|ReplayMode)) == ReplayMode;
  ctx->TTDReplayModeEnabled = bVar5;
  ctx->TTDRecordOrReplayModeEnabled = bVar5 || bVar4;
  auVar6._0_4_ = -(uint)((TVar1 & (AnyExcludedMode|ReplayDebuggerMode|CurrentlyEnabled)) ==
                        (ReplayDebuggerMode|CurrentlyEnabled));
  auVar6._4_4_ = -(uint)((TVar1 & (AnyExcludedMode|RecordDebuggerMode|CurrentlyEnabled)) ==
                        (RecordDebuggerMode|CurrentlyEnabled));
  auVar6._8_4_ = -(uint)((TVar1 & (AnyExcludedMode|ReplayMode|CurrentlyEnabled)) ==
                        (ReplayMode|CurrentlyEnabled));
  auVar6._12_4_ =
       -(uint)((TVar1 & (AnyExcludedMode|RecordMode|CurrentlyEnabled)) ==
              (RecordMode|CurrentlyEnabled));
  uVar2 = movmskps((uint)bVar4,auVar6);
  bVar3 = (byte)uVar2;
  bVar4 = (bool)((bVar3 & 2) >> 1);
  bVar5 = (bool)((bVar3 & 4) >> 2);
  ctx->TTDShouldPerformRecordAction = (bool)(bVar3 >> 3);
  ctx->TTDShouldPerformReplayAction = bVar5;
  ctx->TTDShouldPerformRecordOrReplayAction = (bool)(bVar3 >> 3 | bVar5);
  ctx->TTDShouldPerformRecordDebuggerAction = bVar4;
  ctx->TTDShouldPerformReplayDebuggerAction = (bool)(bVar3 & 1);
  ctx->TTDShouldPerformRecordOrReplayDebuggerAction = (bool)(bVar3 & 1 | bVar4);
  ctx->TTDShouldSuppressGetterInvocationForDebuggerEvaluation = (bool)((byte)(TVar1 >> 9) & 1);
  return;
}

Assistant:

void EventLog::SetModeFlagsOnContext(Js::ScriptContext* ctx)
    {
        TTDMode cm = this->m_currentMode;

        ctx->TTDRecordModeEnabled = (cm & (TTDMode::RecordMode | TTDMode::AnyExcludedMode)) == TTDMode::RecordMode;
        ctx->TTDReplayModeEnabled = (cm & (TTDMode::ReplayMode | TTDMode::AnyExcludedMode)) == TTDMode::ReplayMode;
        ctx->TTDRecordOrReplayModeEnabled = (ctx->TTDRecordModeEnabled | ctx->TTDReplayModeEnabled);

        ctx->TTDShouldPerformRecordAction = (cm & (TTDMode::RecordMode | TTDMode::CurrentlyEnabled | TTDMode::AnyExcludedMode)) == (TTDMode::RecordMode | TTDMode::CurrentlyEnabled);
        ctx->TTDShouldPerformReplayAction = (cm & (TTDMode::ReplayMode | TTDMode::CurrentlyEnabled | TTDMode::AnyExcludedMode)) == (TTDMode::ReplayMode | TTDMode::CurrentlyEnabled);
        ctx->TTDShouldPerformRecordOrReplayAction = (ctx->TTDShouldPerformRecordAction | ctx->TTDShouldPerformReplayAction);

        ctx->TTDShouldPerformRecordDebuggerAction = (cm & (TTDMode::RecordDebuggerMode | TTDMode::CurrentlyEnabled | TTDMode::AnyExcludedMode)) == (TTDMode::RecordDebuggerMode | TTDMode::CurrentlyEnabled);
        ctx->TTDShouldPerformReplayDebuggerAction = (cm & ( TTDMode::ReplayDebuggerMode | TTDMode::CurrentlyEnabled | TTDMode::AnyExcludedMode)) == (TTDMode::ReplayDebuggerMode | TTDMode::CurrentlyEnabled);
        ctx->TTDShouldPerformRecordOrReplayDebuggerAction = (ctx->TTDShouldPerformRecordDebuggerAction | ctx->TTDShouldPerformReplayDebuggerAction);

        ctx->TTDShouldSuppressGetterInvocationForDebuggerEvaluation = (cm & TTDMode::DebuggerSuppressGetter) == TTDMode::DebuggerSuppressGetter;
    }